

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

bool __thiscall QTabBar::isTabEnabled(QTabBar *this,int index)

{
  long lVar1;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (((ulong)(long)index < *(ulong *)(lVar1 + 0x2e8)) &&
     (lVar1 = *(long *)(*(long *)(lVar1 + 0x2e0) + (long)index * 8), lVar1 != 0)) {
    return (bool)(*(byte *)(lVar1 + 0xe4) & 1);
  }
  return false;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }